

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseLengthDelimited
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  uint32_t size_00;
  int size;
  ParseContext *ctx_local;
  char *ptr_local;
  UnknownFieldLiteParserHelper *pUStack_18;
  uint32_t num_local;
  UnknownFieldLiteParserHelper *this_local;
  
  ctx_local = (ParseContext *)ptr;
  ptr_local._4_4_ = num;
  pUStack_18 = this;
  size_00 = ReadSize((char **)&ctx_local);
  if (ctx_local == (ParseContext *)0x0) {
    this_local = (UnknownFieldLiteParserHelper *)0x0;
  }
  else if (this->unknown_ == (string *)0x0) {
    this_local = (UnknownFieldLiteParserHelper *)
                 EpsCopyInputStream::Skip(&ctx->super_EpsCopyInputStream,(char *)ctx_local,size_00);
  }
  else {
    WriteVarint((ulong)(ptr_local._4_4_ * 8 + 2),this->unknown_);
    WriteVarint((long)(int)size_00,this->unknown_);
    this_local = (UnknownFieldLiteParserHelper *)
                 EpsCopyInputStream::AppendString
                           (&ctx->super_EpsCopyInputStream,(char *)ctx_local,size_00,this->unknown_)
    ;
  }
  return (char *)this_local;
}

Assistant:

const char* ParseLengthDelimited(uint32_t num, const char* ptr,
                                   ParseContext* ctx) {
    int size = ReadSize(&ptr);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_ == nullptr) return ctx->Skip(ptr, size);
    WriteVarint(num * 8 + 2, unknown_);
    WriteVarint(size, unknown_);
    return ctx->AppendString(ptr, size, unknown_);
  }